

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rhombicLattice.cpp
# Opt level: O2

int __thiscall
RhombicLattice::neighbour(RhombicLattice *this,int vertexIndex,string *direction,int sign)

{
  undefined1 auVar1 [12];
  undefined1 auVar2 [12];
  undefined1 auVar3 [12];
  undefined1 auVar4 [12];
  undefined1 auVar5 [12];
  cartesian4 cVar6;
  bool bVar7;
  uint uVar8;
  int iVar9;
  ostream *poVar10;
  invalid_argument *piVar11;
  uint uVar12;
  uint uVar13;
  cartesian4 cVar14;
  cartesian4 local_210;
  int local_1fc;
  string errorMessage;
  cartesian4 errorCoord;
  string errorDir;
  ostringstream stream;
  
  if ((sign != -1) && (sign != 1)) {
    piVar11 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar11,"Sign must be either 1 or -1.");
LAB_0012250d:
    __cxa_throw(piVar11,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  bVar7 = std::operator==(direction,"xy");
  if ((((!bVar7) && (bVar7 = std::operator==(direction,"xz"), !bVar7)) &&
      (bVar7 = std::operator==(direction,"yz"), !bVar7)) &&
     (bVar7 = std::operator==(direction,"xyz"), !bVar7)) {
    piVar11 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (piVar11,"Direction must be one of \'xy\', \'xz\', \'yz\' or \'xyz\'.");
    goto LAB_0012250d;
  }
  local_1fc = vertexIndex;
  cVar14 = Lattice::indexToCoordinate(&this->super_Lattice,vertexIndex);
  auVar1 = cVar14._0_12_;
  uVar13 = cVar14.y;
  local_210 = cVar14;
  bVar7 = std::operator==(direction,"xy");
  iVar9 = sign >> 0x1f;
  if (cVar14.w == 1) {
    if (bVar7) {
      local_210.x = cVar14.x + (uint)(0 < sign);
      auVar1._4_4_ = 0;
      auVar1._0_4_ = local_210.x;
      uVar13 = uVar13 + (0 < sign);
      local_210.y = uVar13;
      local_210.z = cVar14.z - iVar9;
      local_210.w = 0;
      auVar1._8_4_ = local_210.z;
    }
    bVar7 = std::operator==(direction,"xz");
    cVar14 = local_210;
    if (bVar7) {
      uVar12 = auVar1._0_4_ + (uint)(0 < sign);
      auVar3._4_4_ = 0;
      auVar3._0_4_ = uVar12;
      local_210.x = uVar12;
      cVar6 = local_210;
      local_210.z = auVar1._8_4_ + (uint)(0 < sign);
      auVar3._8_4_ = local_210.z;
      local_210.w = cVar14.w;
      local_210._0_8_ = cVar6._0_8_;
      uVar13 = uVar13 - iVar9;
      local_210.y = uVar13;
      local_210.w = 0;
      auVar1 = auVar3;
    }
    bVar7 = std::operator==(direction,"yz");
    cVar14 = local_210;
    if (bVar7) {
      uVar13 = uVar13 + (0 < sign);
      auVar4._4_4_ = local_210.z;
      auVar4._8_4_ = local_210.w;
      auVar4._0_4_ = uVar13;
      local_210._0_8_ = auVar4._0_8_ << 0x20;
      local_210.z = auVar1._8_4_ + (uint)(0 < sign);
      local_210.w = cVar14.w;
      uVar12 = auVar1._0_4_ - iVar9;
      auVar1._4_4_ = 0;
      auVar1._0_4_ = uVar12;
      auVar1._8_4_ = local_210.z;
      local_210.x = uVar12;
      local_210.w = 0;
    }
    bVar7 = std::operator==(direction,"xyz");
    if (bVar7) {
      uVar8 = (uint)(0 < sign);
      uVar12 = auVar1._0_4_ + uVar8;
      uVar13 = uVar13 + uVar8;
      local_210.y = uVar13;
      local_210.x = uVar12;
      local_210.z = auVar1._8_4_ + uVar8;
      local_210.w = 0;
LAB_00122453:
      auVar1._4_4_ = 0;
      auVar1._0_4_ = uVar12;
      auVar1._8_4_ = local_210.z;
    }
  }
  else {
    if (bVar7) {
      local_210.x = cVar14.x + iVar9;
      auVar1._4_4_ = 0;
      auVar1._0_4_ = local_210.x;
      uVar13 = uVar13 + iVar9;
      local_210.y = uVar13;
      local_210.z = cVar14.z - (uint)(0 < sign);
      auVar1._8_4_ = local_210.z;
      local_210.w = 1;
    }
    bVar7 = std::operator==(direction,"xz");
    cVar14 = local_210;
    if (bVar7) {
      uVar12 = auVar1._0_4_ + iVar9;
      auVar2._4_4_ = 0;
      auVar2._0_4_ = uVar12;
      local_210.x = uVar12;
      cVar6 = local_210;
      local_210.z = auVar1._8_4_ + iVar9;
      auVar2._8_4_ = local_210.z;
      local_210.w = cVar14.w;
      local_210._0_8_ = cVar6._0_8_;
      uVar13 = uVar13 - (0 < sign);
      local_210.y = uVar13;
      local_210.w = 1;
      auVar1 = auVar2;
    }
    bVar7 = std::operator==(direction,"yz");
    cVar14 = local_210;
    if (bVar7) {
      uVar13 = uVar13 + iVar9;
      auVar5._4_4_ = local_210.z;
      auVar5._8_4_ = local_210.w;
      auVar5._0_4_ = uVar13;
      local_210._0_8_ = auVar5._0_8_ << 0x20;
      local_210.z = auVar1._8_4_ + iVar9;
      local_210.w = cVar14.w;
      uVar12 = auVar1._0_4_ - (uint)(0 < sign);
      auVar1._4_4_ = 0;
      auVar1._0_4_ = uVar12;
      auVar1._8_4_ = local_210.z;
      local_210.x = uVar12;
      local_210.w = 1;
    }
    bVar7 = std::operator==(direction,"xyz");
    if (bVar7) {
      uVar12 = auVar1._0_4_ + iVar9;
      uVar13 = uVar13 + iVar9;
      local_210.y = uVar13;
      local_210.x = uVar12;
      local_210.z = auVar1._8_4_ + iVar9;
      local_210.w = 1;
      goto LAB_00122453;
    }
  }
  if ((((-1 < auVar1._0_4_) && (uVar12 = (this->super_Lattice).l, auVar1._0_4_ < (int)uVar12)) &&
      ((-1 < (int)uVar13 && ((uVar13 < uVar12 && (-1 < auVar1._8_4_)))))) &&
     (auVar1._8_4_ < (int)uVar12)) {
    iVar9 = Lattice::coordinateToIndex(&this->super_Lattice,&local_210);
    return iVar9;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&stream);
  errorCoord = Lattice::indexToCoordinate(&this->super_Lattice,local_1fc);
  errorDir._M_dataplus._M_p = (pointer)&errorDir.field_2;
  errorDir._M_string_length = 0;
  errorDir.field_2._M_local_buf[0] = '\0';
  if (sign == -1) {
    std::operator+(&errorMessage,"-",direction);
  }
  else {
    if (sign != 1) goto LAB_00122551;
    std::operator+(&errorMessage,"+",direction);
  }
  std::__cxx11::string::operator=((string *)&errorDir,(string *)&errorMessage);
  std::__cxx11::string::~string((string *)&errorMessage);
LAB_00122551:
  poVar10 = std::operator<<((ostream *)&stream,"RhombicLattice::neighbour, ");
  poVar10 = std::operator<<(poVar10,(string *)&errorDir);
  poVar10 = std::operator<<(poVar10," neighbour of ");
  poVar10 = operator<<(poVar10,&errorCoord);
  std::operator<<(poVar10," is outside the lattice.");
  std::__cxx11::stringbuf::str();
  piVar11 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar11,(string *)&errorMessage);
  __cxa_throw(piVar11,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

int RhombicLattice::neighbour(const int vertexIndex, const std::string &direction, const int sign)
{
    if (!(sign == 1 || sign == -1))
    {
        throw std::invalid_argument("Sign must be either 1 or -1.");
    }
    if (!(direction == "xy" || direction == "xz" || direction == "yz" ||
          direction == "xyz"))
    {
        throw std::invalid_argument("Direction must be one of 'xy', 'xz', 'yz' or 'xyz'.");
    }
    cartesian4 coordinate;
    coordinate = indexToCoordinate(vertexIndex);
    if (coordinate.w == 1)
    {
        if (direction == "xy")
        {
            coordinate.x = (coordinate.x + (sign > 0));
            coordinate.y = (coordinate.y + (sign > 0));
            coordinate.z = (coordinate.z + (sign < 0));
            coordinate.w = 0;
        }
        if (direction == "xz")
        {
            coordinate.x = (coordinate.x + (sign > 0));
            coordinate.z = (coordinate.z + (sign > 0));
            coordinate.y = (coordinate.y + (sign < 0));
            coordinate.w = 0;
        }
        if (direction == "yz")
        {
            coordinate.y = (coordinate.y + (sign > 0));
            coordinate.z = (coordinate.z + (sign > 0));
            coordinate.x = (coordinate.x + (sign < 0));
            coordinate.w = 0;
        }
        if (direction == "xyz")
        {
            coordinate.x = (coordinate.x + (sign > 0));
            coordinate.y = (coordinate.y + (sign > 0));
            coordinate.z = (coordinate.z + (sign > 0));
            coordinate.w = 0;
        }
    }
    else
    {
        if (direction == "xy")
        {
            coordinate.x = (coordinate.x - (sign < 0));
            coordinate.y = (coordinate.y - (sign < 0));
            coordinate.z = (coordinate.z - (sign > 0));
            coordinate.w = 1;
        }
        if (direction == "xz")
        {
            coordinate.x = (coordinate.x - (sign < 0));
            coordinate.z = (coordinate.z - (sign < 0));
            coordinate.y = (coordinate.y - (sign > 0));
            coordinate.w = 1;
        }
        if (direction == "yz")
        {
            coordinate.y = (coordinate.y - (sign < 0));
            coordinate.z = (coordinate.z - (sign < 0));
            coordinate.x = (coordinate.x - (sign > 0));
            coordinate.w = 1;
        }
        if (direction == "xyz")
        {
            coordinate.x = (coordinate.x - (sign < 0));
            coordinate.y = (coordinate.y - (sign < 0));
            coordinate.z = (coordinate.z - (sign < 0));
            coordinate.w = 1;
        }
    }
    if (coordinate.x < 0 || coordinate.x >= l || coordinate.y < 0 || coordinate.y >= l || coordinate.z < 0 || coordinate.z >= l)
    {
        std::ostringstream stream;
        cartesian4 errorCoord = indexToCoordinate(vertexIndex);
        std::string errorDir;
        if (sign == 1)
        {
            errorDir = "+" + direction;
        }
        else if (sign == -1)
        {
            errorDir = "-" + direction;
        }
        stream << "RhombicLattice::neighbour, " << errorDir << " neighbour of " << errorCoord << " is outside the lattice.";
        std::string errorMessage = stream.str();
        throw std::invalid_argument(errorMessage);
    }
    else
    {
        return coordinateToIndex(coordinate);
    }
}